

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

EnumVal * __thiscall flatbuffers::EnumDef::FindByValue(EnumDef *this,string *constant)

{
  char *pcVar1;
  char *str;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  pointer ppEVar5;
  uint64_t u64;
  int64_t i64;
  unsigned_long local_28;
  unsigned_long local_20;
  
  if ((this->underlying_type).base_type == BASE_TYPE_ULONG) {
    str = (constant->_M_dataplus)._M_p;
    bVar3 = false;
    bVar2 = StringToIntegerImpl<unsigned_long>(&local_28,str,0,true);
    if ((bVar2) && (bVar3 = true, local_28 != 0)) {
      pcVar4 = str + -1;
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
        if (*pcVar1 == '\0') break;
      } while (9 < (int)*pcVar1 - 0x30U);
      if (pcVar4[-(ulong)(str < pcVar4)] == '-') {
        local_28 = 0xffffffffffffffff;
        bVar3 = false;
      }
    }
    local_20 = local_28;
  }
  else {
    bVar3 = StringToIntegerImpl<long>((long *)&local_20,(constant->_M_dataplus)._M_p,0,true);
  }
  if (bVar3 == false) {
    __assert_fail("done",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x916,"EnumVal *flatbuffers::EnumDef::FindByValue(const std::string &) const");
  }
  ppEVar5 = (this->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppEVar5 ==
        (this->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (EnumVal *)0x0;
    }
    if ((*ppEVar5)->value == local_20) break;
    ppEVar5 = ppEVar5 + 1;
  }
  return *ppEVar5;
}

Assistant:

EnumVal *EnumDef::FindByValue(const std::string &constant) const {
  int64_t i64;
  auto done = false;
  if (IsUInt64()) {
    uint64_t u64;  // avoid reinterpret_cast of pointers
    done = StringToNumber(constant.c_str(), &u64);
    i64 = static_cast<int64_t>(u64);
  } else {
    done = StringToNumber(constant.c_str(), &i64);
  }
  FLATBUFFERS_ASSERT(done);
  if (!done) return nullptr;
  return ReverseLookup(i64, false);
}